

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap_base.h
# Opt level: O2

template_ElementType<1UL> * __thiscall
phmap::priv::
btree_node<phmap::priv::map_params<int,int,std::less<int>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int_const,int>>,256,false>>
::GetField<1ul>(btree_node<phmap::priv::map_params<int,int,std::less<int>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<int_const,int>>,256,false>>
                *this)

{
  if (((ulong)this & 7) == 0) {
    return (template_ElementType<1UL> *)(this + 8);
  }
  __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                ,0xf84,
                "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::map_params<int, int, std::less<int>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const int, int>>, 256, false>> *, unsigned char, phmap::priv::map_slot_type<int, int>, phmap::priv::btree_node<phmap::priv::map_params<int, int, std::less<int>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const int, int>>, 256, false>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::map_params<int, int, std::less<int>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const int, int>>, 256, false>> *, unsigned char, phmap::priv::map_slot_type<int, int>, phmap::priv::btree_node<phmap::priv::map_params<int, int, std::less<int>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const int, int>>, 256, false>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 1UL, Char = char]"
               );
}

Assistant:

CopyConst<Char, ElementType<N>>* Pointer(Char* p) const {
        using C = typename std::remove_const<Char>::type;
        static_assert(
            std::is_same<C, char>() || std::is_same<C, unsigned char>() ||
            std::is_same<C, signed char>(),
            "The argument must be a pointer to [const] [signed|unsigned] char");
        constexpr size_t alignment = Alignment();
        (void)alignment;
        assert(reinterpret_cast<uintptr_t>(p) % alignment == 0);
        return reinterpret_cast<CopyConst<Char, ElementType<N>>*>(p + Offset<N>());
    }